

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

_Bool imap_matchresp(char *line,size_t len,char *cmd)

{
  byte *pbVar1;
  long lVar2;
  int iVar3;
  size_t max;
  byte *pbVar4;
  long lVar5;
  byte *pbVar6;
  
  pbVar1 = (byte *)(line + len);
  max = strlen(cmd);
  pbVar6 = (byte *)(line + 2);
  if ((2 < (long)len) && (iVar3 = Curl_isdigit((uint)*pbVar6), iVar3 != 0)) {
    pbVar6 = (byte *)(line + 3);
    lVar2 = 0;
    do {
      lVar5 = lVar2;
      pbVar4 = pbVar6;
      if (pbVar1 <= pbVar4) break;
      iVar3 = Curl_isdigit((uint)*pbVar4);
      pbVar6 = pbVar4 + 1;
      lVar2 = lVar5 + -1;
    } while (iVar3 != 0);
    if (3 - len == lVar5) {
      return false;
    }
    if (*pbVar4 != 0x20) {
      return false;
    }
    pbVar6 = (byte *)(line + (4 - lVar5));
  }
  pbVar4 = pbVar6 + max;
  if (((pbVar4 <= pbVar1) && (iVar3 = Curl_strncasecompare((char *)pbVar6,cmd,max), iVar3 != 0)) &&
     (pbVar4 + 2 == pbVar1 || *pbVar4 == 0x20)) {
    return true;
  }
  return false;
}

Assistant:

static bool imap_matchresp(const char *line, size_t len, const char *cmd)
{
  const char *end = line + len;
  size_t cmd_len = strlen(cmd);

  /* Skip the untagged response marker */
  line += 2;

  /* Do we have a number after the marker? */
  if(line < end && ISDIGIT(*line)) {
    /* Skip the number */
    do
      line++;
    while(line < end && ISDIGIT(*line));

    /* Do we have the space character? */
    if(line == end || *line != ' ')
      return FALSE;

    line++;
  }

  /* Does the command name match and is it followed by a space character or at
     the end of line? */
  if(line + cmd_len <= end && strncasecompare(line, cmd, cmd_len) &&
     (line[cmd_len] == ' ' || line + cmd_len + 2 == end))
    return TRUE;

  return FALSE;
}